

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

void __thiscall XmlOutput::closeTag(XmlOutput *this)

{
  qsizetype qVar1;
  ulong uVar2;
  QTextStream *pQVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffff78;
  XmlOutput *in_stack_ffffffffffffff80;
  int line;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  undefined1 local_60 [24];
  char local_48 [8];
  QString *in_stack_ffffffffffffffc0;
  XmlOutput *in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = *(int *)(in_RDI + 0x3c);
  if (iVar4 == 0) {
    qVar1 = QList<QString>::size((QList<QString> *)(in_RDI + 0x48));
    line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (qVar1 == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(iVar4,in_stack_ffffffffffffff90),in_RDI,line,
                 (char *)in_stack_ffffffffffffff78);
      QMessageLogger::debug(local_48,"<Root>: Cannot close tag, no tags on stack");
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(iVar4,in_stack_ffffffffffffff90),in_RDI,line,
                 (char *)in_stack_ffffffffffffff78);
      uVar2 = QList<QString>::size((QList<QString> *)(in_RDI + 0x48));
      QMessageLogger::debug
                (local_28,"<Root>: Cannot close tag in Bare state, %d tags on stack",
                 uVar2 & 0xffffffff);
    }
  }
  else if (iVar4 == 1) {
    decreaseIndent(in_stack_ffffffffffffff80);
    if (*(int *)(in_RDI + 0x40) == 1) {
      pQVar3 = ::operator<<((QTextStream *)in_stack_ffffffffffffff80,
                            (QTextStreamFunction)in_stack_ffffffffffffff78);
      QTextStream::operator<<(pQVar3,(QString *)(in_RDI + 0x20));
    }
    pQVar3 = (QTextStream *)QTextStream::operator<<(*(QTextStream **)in_RDI,"</");
    QList<QString>::last(in_stack_ffffffffffffff78);
    doConversion(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_60);
    QTextStream::operator<<(pQVar3,'>');
    QString::~QString((QString *)0x2c23f9);
    QList<QString>::pop_back((QList<QString> *)0x2c2407);
  }
  else if (iVar4 == 2) {
    QTextStream::operator<<(*(QTextStream **)in_RDI," />");
    QList<QString>::pop_back((QList<QString> *)0x2c242b);
    in_RDI[0x3c] = '\x01';
    in_RDI[0x3d] = '\0';
    in_RDI[0x3e] = '\0';
    in_RDI[0x3f] = '\0';
    decreaseIndent(in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void XmlOutput::closeTag()
{
    switch(currentState) {
        case Bare:
            if (tagStack.size())
                //warn_msg(WarnLogic, "<Root>: Cannot close tag in Bare state, %d tags on stack", tagStack.count());
                qDebug("<Root>: Cannot close tag in Bare state, %d tags on stack", int(tagStack.size()));
            else
                //warn_msg(WarnLogic, "<Root>: Cannot close tag, no tags on stack");
                qDebug("<Root>: Cannot close tag, no tags on stack");
            return;
        case Tag:
            decreaseIndent(); // <--- Pre-decrease indent
            if (format == NewLine)
                xmlFile << Qt::endl << currentIndent;
            xmlFile << "</" << doConversion(tagStack.last()) << '>';
            tagStack.pop_back();
            break;
        case Attribute:
            xmlFile << " />";
            tagStack.pop_back();
            currentState = Tag;
            decreaseIndent(); // <--- Post-decrease indent
            break;
    }
}